

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O2

KcpTcpEventLoop * sznet::down_cast<sznet::net::KcpTcpEventLoop*,sznet::net::EventLoop>(EventLoop *f)

{
  long lVar1;
  
  if (f != (EventLoop *)0x0) {
    lVar1 = __dynamic_cast(f,&net::EventLoop::typeinfo,&net::KcpTcpEventLoop::typeinfo,0);
    if (lVar1 == 0) {
      __assert_fail("f == NULL || dynamic_cast<To>(f) != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/../base/Types.h"
                    ,0x6e,
                    "To sznet::down_cast(From *) [To = sznet::net::KcpTcpEventLoop *, From = sznet::net::EventLoop]"
                   );
    }
  }
  return (KcpTcpEventLoop *)f;
}

Assistant:

inline To down_cast(From* f)                     // so we only accept pointers
{
	// Ensures that To is a sub-type of From *.  This test is here only
	// for compile-time type checking, and has no overhead in an
	// optimized build at run-time, as it will be optimized away
	// completely.
	if (false)
	{
		implicit_cast<From*, To>(0);
	}

#if !defined(NDEBUG) && !defined(GOOGLE_PROTOBUF_NO_RTTI)
	assert(f == NULL || dynamic_cast<To>(f) != NULL);  // RTTI: debug mode only!
#endif
	return static_cast<To>(f);
}